

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int manual_check(nvamemtiming_conf *conf)

{
  FILE *__stream;
  long in_RDI;
  bool bVar1;
  FILE *outf;
  char outfile [21];
  color in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  nvamemtiming_conf *in_stack_ffffffffffffffd8;
  uint local_4;
  
  snprintf(&stack0xffffffffffffffd8,0x14,"entry_%i_%i",(ulong)*(byte *)(in_RDI + 0x10),
           (ulong)*(byte *)(in_RDI + 0x11));
  __stream = fopen(&stack0xffffffffffffffd8,"wb");
  bVar1 = __stream != (FILE *)0x0;
  if (bVar1) {
    printf("Manual mode: set index %i to value 0x%x\n",(ulong)*(byte *)(in_RDI + 0x10),
           (ulong)*(byte *)(in_RDI + 0x11));
    *(undefined1 *)
     (*(long *)(in_RDI + 0x20) +
     (long)(int)((uint)*(ushort *)(in_RDI + 0x2c) + (uint)*(byte *)(in_RDI + 0x10))) =
         *(undefined1 *)(in_RDI + 0x11);
    launch(in_stack_ffffffffffffffd8,(FILE *)__stream,in_stack_ffffffffffffffcf,
           in_stack_ffffffffffffffc8);
    fclose(__stream);
  }
  else {
    perror("Open the output file");
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int manual_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_%i_%i", conf->manual.index, conf->manual.value);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Manual mode: set index %i to value 0x%x\n", conf->manual.index, conf->manual.value);

	conf->vbios.data[conf->vbios.timing_entry_offset + conf->manual.index] = conf->manual.value;
	launch(conf, outf, 0, NO_COLOR);

	fclose(outf);

	return 0;
}